

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall
Utf8Decode_IllegalCodePositions_Test::TestBody(Utf8Decode_IllegalCodePositions_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  allocator<unsigned_char> local_4cf;
  uchar local_4ce [6];
  iterator local_4c8;
  size_type local_4c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4b8;
  cpstring local_4a0;
  allocator<unsigned_char> local_47f;
  uchar local_47e [6];
  iterator local_478;
  size_type local_470;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_468;
  cpstring local_450;
  allocator<unsigned_char> local_42f;
  uchar local_42e [6];
  iterator local_428;
  size_type local_420;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_418;
  cpstring local_400;
  allocator<unsigned_char> local_3df;
  uchar local_3de [6];
  iterator local_3d8;
  size_type local_3d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3c8;
  cpstring local_3b0;
  allocator<unsigned_char> local_38f;
  uchar local_38e [6];
  iterator local_388;
  size_type local_380;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_378;
  cpstring local_360;
  allocator<unsigned_char> local_33f;
  uchar local_33e [6];
  iterator local_338;
  size_type local_330;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  cpstring local_310;
  allocator<unsigned_char> local_2ef;
  uchar local_2ee [6];
  iterator local_2e8;
  size_type local_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2d8;
  cpstring local_2c0;
  allocator<unsigned_char> local_29f;
  uchar local_29e [6];
  iterator local_298;
  size_type local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  cpstring local_270;
  allocator<unsigned_char> local_24c;
  uchar local_24b [3];
  iterator local_248;
  size_type local_240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  cpstring local_220;
  allocator<unsigned_char> local_1fc;
  uchar local_1fb [3];
  iterator local_1f8;
  size_type local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  cpstring local_1d0;
  allocator<unsigned_char> local_1ac;
  uchar local_1ab [3];
  iterator local_1a8;
  size_type local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  cpstring local_180;
  allocator<unsigned_char> local_15c;
  uchar local_15b [3];
  iterator local_158;
  size_type local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  cpstring local_130;
  allocator<unsigned_char> local_10c;
  uchar local_10b [3];
  iterator local_108;
  size_type local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  cpstring local_e0;
  allocator<unsigned_char> local_bc;
  uchar local_bb [3];
  iterator local_b8;
  size_type local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  cpstring local_90;
  allocator<unsigned_char> local_5c;
  uchar local_5b [3];
  iterator local_58;
  size_type local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  cpstring local_30;
  Utf8Decode_IllegalCodePositions_Test *local_10;
  Utf8Decode_IllegalCodePositions_Test *this_local;
  
  local_5b[0] = 0xed;
  local_5b[1] = 0xa0;
  local_5b[2] = 0x80;
  local_58 = local_5b;
  local_50 = 3;
  local_10 = this;
  std::allocator<unsigned_char>::allocator(&local_5c);
  __l_13._M_len = local_50;
  __l_13._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,__l_13,&local_5c);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_30,this,&local_48);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  std::allocator<unsigned_char>::~allocator(&local_5c);
  local_bb[0] = 0xed;
  local_bb[1] = 0xad;
  local_bb[2] = 0xbf;
  local_b8 = local_bb;
  local_b0 = 3;
  std::allocator<unsigned_char>::allocator(&local_bc);
  __l_12._M_len = local_b0;
  __l_12._M_array = local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,__l_12,&local_bc);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_90,this,&local_a8);
  std::__cxx11::u32string::~u32string((u32string *)&local_90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a8);
  std::allocator<unsigned_char>::~allocator(&local_bc);
  local_10b[0] = 0xed;
  local_10b[1] = 0xae;
  local_10b[2] = 0x80;
  local_108 = local_10b;
  local_100 = 3;
  std::allocator<unsigned_char>::allocator(&local_10c);
  __l_11._M_len = local_100;
  __l_11._M_array = local_108;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f8,__l_11,&local_10c);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_e0,this,&local_f8);
  std::__cxx11::u32string::~u32string((u32string *)&local_e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f8);
  std::allocator<unsigned_char>::~allocator(&local_10c);
  local_15b[0] = 0xed;
  local_15b[1] = 0xaf;
  local_15b[2] = 0xbf;
  local_158 = local_15b;
  local_150 = 3;
  std::allocator<unsigned_char>::allocator(&local_15c);
  __l_10._M_len = local_150;
  __l_10._M_array = local_158;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_148,__l_10,&local_15c);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_130,this,&local_148);
  std::__cxx11::u32string::~u32string((u32string *)&local_130);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_148);
  std::allocator<unsigned_char>::~allocator(&local_15c);
  local_1ab[0] = 0xed;
  local_1ab[1] = 0xb0;
  local_1ab[2] = 0x80;
  local_1a8 = local_1ab;
  local_1a0 = 3;
  std::allocator<unsigned_char>::allocator(&local_1ac);
  __l_09._M_len = local_1a0;
  __l_09._M_array = local_1a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_198,__l_09,&local_1ac);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_180,this,&local_198);
  std::__cxx11::u32string::~u32string((u32string *)&local_180);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_198);
  std::allocator<unsigned_char>::~allocator(&local_1ac);
  local_1fb[0] = 0xed;
  local_1fb[1] = 0xbe;
  local_1fb[2] = 0x80;
  local_1f8 = local_1fb;
  local_1f0 = 3;
  std::allocator<unsigned_char>::allocator(&local_1fc);
  __l_08._M_len = local_1f0;
  __l_08._M_array = local_1f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1e8,__l_08,&local_1fc);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_1d0,this,&local_1e8);
  std::__cxx11::u32string::~u32string((u32string *)&local_1d0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1e8);
  std::allocator<unsigned_char>::~allocator(&local_1fc);
  local_24b[0] = 0xed;
  local_24b[1] = 0xbf;
  local_24b[2] = 0xbf;
  local_248 = local_24b;
  local_240 = 3;
  std::allocator<unsigned_char>::allocator(&local_24c);
  __l_07._M_len = local_240;
  __l_07._M_array = local_248;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_07,&local_24c);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_220,this,&local_238);
  std::__cxx11::u32string::~u32string((u32string *)&local_220);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_238);
  std::allocator<unsigned_char>::~allocator(&local_24c);
  local_29e[0] = 0xed;
  local_29e[1] = 0xa0;
  local_29e[2] = 0x80;
  local_29e[3] = 0xed;
  local_29e[4] = 0xb0;
  local_29e[5] = 0x80;
  local_298 = local_29e;
  local_290 = 6;
  std::allocator<unsigned_char>::allocator(&local_29f);
  __l_06._M_len = local_290;
  __l_06._M_array = local_298;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_288,__l_06,&local_29f);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_270,this,&local_288);
  std::__cxx11::u32string::~u32string((u32string *)&local_270);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_288);
  std::allocator<unsigned_char>::~allocator(&local_29f);
  local_2ee[0] = 0xed;
  local_2ee[1] = 0xa0;
  local_2ee[2] = 0x80;
  local_2ee[3] = 0xed;
  local_2ee[4] = 0xbf;
  local_2ee[5] = 0xbf;
  local_2e8 = local_2ee;
  local_2e0 = 6;
  std::allocator<unsigned_char>::allocator(&local_2ef);
  __l_05._M_len = local_2e0;
  __l_05._M_array = local_2e8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2d8,__l_05,&local_2ef);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_2c0,this,&local_2d8);
  std::__cxx11::u32string::~u32string((u32string *)&local_2c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2d8);
  std::allocator<unsigned_char>::~allocator(&local_2ef);
  local_33e[0] = 0xed;
  local_33e[1] = 0xad;
  local_33e[2] = 0xbf;
  local_33e[3] = 0xed;
  local_33e[4] = 0xb0;
  local_33e[5] = 0x80;
  local_338 = local_33e;
  local_330 = 6;
  std::allocator<unsigned_char>::allocator(&local_33f);
  __l_04._M_len = local_330;
  __l_04._M_array = local_338;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_328,__l_04,&local_33f);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_310,this,&local_328);
  std::__cxx11::u32string::~u32string((u32string *)&local_310);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_328);
  std::allocator<unsigned_char>::~allocator(&local_33f);
  local_38e[0] = 0xed;
  local_38e[1] = 0xad;
  local_38e[2] = 0xbf;
  local_38e[3] = 0xed;
  local_38e[4] = 0xbf;
  local_38e[5] = 0xbf;
  local_388 = local_38e;
  local_380 = 6;
  std::allocator<unsigned_char>::allocator(&local_38f);
  __l_03._M_len = local_380;
  __l_03._M_array = local_388;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_378,__l_03,&local_38f);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_360,this,&local_378);
  std::__cxx11::u32string::~u32string((u32string *)&local_360);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_378);
  std::allocator<unsigned_char>::~allocator(&local_38f);
  local_3de[0] = 0xed;
  local_3de[1] = 0xae;
  local_3de[2] = 0x80;
  local_3de[3] = 0xed;
  local_3de[4] = 0xb0;
  local_3de[5] = 0x80;
  local_3d8 = local_3de;
  local_3d0 = 6;
  std::allocator<unsigned_char>::allocator(&local_3df);
  __l_02._M_len = local_3d0;
  __l_02._M_array = local_3d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3c8,__l_02,&local_3df);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_3b0,this,&local_3c8);
  std::__cxx11::u32string::~u32string((u32string *)&local_3b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3c8);
  std::allocator<unsigned_char>::~allocator(&local_3df);
  local_42e[0] = 0xed;
  local_42e[1] = 0xae;
  local_42e[2] = 0x80;
  local_42e[3] = 0xed;
  local_42e[4] = 0xbf;
  local_42e[5] = 0xbf;
  local_428 = local_42e;
  local_420 = 6;
  std::allocator<unsigned_char>::allocator(&local_42f);
  __l_01._M_len = local_420;
  __l_01._M_array = local_428;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_418,__l_01,&local_42f);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_400,this,&local_418);
  std::__cxx11::u32string::~u32string((u32string *)&local_400);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_418);
  std::allocator<unsigned_char>::~allocator(&local_42f);
  local_47e[0] = 0xed;
  local_47e[1] = 0xaf;
  local_47e[2] = 0xbf;
  local_47e[3] = 0xed;
  local_47e[4] = 0xb0;
  local_47e[5] = 0x80;
  local_478 = local_47e;
  local_470 = 6;
  std::allocator<unsigned_char>::allocator(&local_47f);
  __l_00._M_len = local_470;
  __l_00._M_array = local_478;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_468,__l_00,&local_47f);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_450,this,&local_468);
  std::__cxx11::u32string::~u32string((u32string *)&local_450);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_468);
  std::allocator<unsigned_char>::~allocator(&local_47f);
  local_4ce[0] = 0xed;
  local_4ce[1] = 0xaf;
  local_4ce[2] = 0xbf;
  local_4ce[3] = 0xed;
  local_4ce[4] = 0xbf;
  local_4ce[5] = 0xbf;
  local_4c8 = local_4ce;
  local_4c0 = 6;
  std::allocator<unsigned_char>::allocator(&local_4cf);
  __l._M_len = local_4c0;
  __l._M_array = local_4c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_4b8,__l,&local_4cf);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_4a0,this,&local_4b8);
  std::__cxx11::u32string::~u32string((u32string *)&local_4a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4b8);
  std::allocator<unsigned_char>::~allocator(&local_4cf);
  return;
}

Assistant:

TEST_F (Utf8Decode, IllegalCodePositions) {
    // Single UTF-16 surrogates
    decode_bad (bytes ({0xED, 0xA0, 0x80})); // U+D800
    decode_bad (bytes ({0xED, 0xAD, 0xBF})); // U+DB7F
    decode_bad (bytes ({0xED, 0xAE, 0x80})); // U+DB80
    decode_bad (bytes ({0xED, 0xAF, 0xBF})); // U+DBFF
    decode_bad (bytes ({0xED, 0xB0, 0x80})); // U+DC00
    decode_bad (bytes ({0xED, 0xBE, 0x80})); // U+DF80
    decode_bad (bytes ({0xED, 0xBF, 0xBF})); // U+DFFF

    // Paired UTF-16 surrogates
    decode_bad (bytes ({0xED, 0xA0, 0x80, 0xED, 0xB0, 0x80})); // U+D800 U+DC00
    decode_bad (bytes ({0xED, 0xA0, 0x80, 0xED, 0xBF, 0xBF})); // U+D800 U+DFFF
    decode_bad (bytes ({0xED, 0xAD, 0xBF, 0xED, 0xB0, 0x80})); // U+DB7F U+DC00
    decode_bad (bytes ({0xED, 0xAD, 0xBF, 0xED, 0xBF, 0xBF})); // U+DB7F U+DFFF
    decode_bad (bytes ({0xED, 0xAE, 0x80, 0xED, 0xB0, 0x80})); // U+DB80 U+DC00
    decode_bad (bytes ({0xED, 0xAE, 0x80, 0xED, 0xBF, 0xBF})); // U+DB80 U+DFFF
    decode_bad (bytes ({0xED, 0xAF, 0xBF, 0xED, 0xB0, 0x80})); // U+DBFF U+DC00
    decode_bad (bytes ({0xED, 0xAF, 0xBF, 0xED, 0xBF, 0xBF})); // U+DBFF U+DFFF
}